

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

bool __thiscall QComboBoxPrivate::updateHoverControl(QComboBoxPrivate *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  SubControl SVar3;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  bool doesHover;
  SubControl lastHoverControl;
  QComboBox *q;
  QRect lastHoverRect;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  SubControl SVar4;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  SVar4 = in_RDI->hoverControl;
  bVar2 = QWidget::testAttribute
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (WidgetAttribute)((ulong)in_RDI >> 0x20));
  uVar5 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffc0);
  SVar3 = newHoverControl((QComboBoxPrivate *)CONCAT44(SVar4,uVar5),
                          (QPoint *)CONCAT44(SVar4,in_stack_ffffffffffffffb8));
  if ((SVar4 == SVar3) || ((uVar5 & 0x1000000) == 0)) {
    local_19 = (bool)(((byte)(uVar5 >> 0x18) ^ 0xff) & 1);
  }
  else {
    QWidget::update((QWidget *)CONCAT44(SVar4,in_stack_ffffffffffffffb8),(QRect *)in_RDI);
    QWidget::update((QWidget *)CONCAT44(SVar4,in_stack_ffffffffffffffb8),(QRect *)in_RDI);
    local_19 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QComboBoxPrivate::updateHoverControl(const QPoint &pos)
{

    Q_Q(QComboBox);
    QRect lastHoverRect = hoverRect;
    QStyle::SubControl lastHoverControl = hoverControl;
    bool doesHover = q->testAttribute(Qt::WA_Hover);
    if (lastHoverControl != newHoverControl(pos) && doesHover) {
        q->update(lastHoverRect);
        q->update(hoverRect);
        return true;
    }
    return !doesHover;
}